

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::
SmallVectorBase<std::pair<std::pair<unsigned_long,unsigned_long>,slang::ast::ValueDriver_const*>>::
emplaceRealloc<std::pair<std::pair<unsigned_long,unsigned_long>,slang::ast::ValueDriver_const*>>
          (SmallVectorBase<std::pair<std::pair<unsigned_long,unsigned_long>,slang::ast::ValueDriver_const*>>
           *this,pointer pos,
          pair<std::pair<unsigned_long,_unsigned_long>,_const_slang::ast::ValueDriver_*> *args)

{
  undefined8 *puVar1;
  ulong uVar2;
  pointer p;
  long lVar3;
  unsigned_long uVar4;
  undefined8 uVar5;
  pointer ppVar6;
  unsigned_long *puVar7;
  unsigned_long *puVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  
  if (*(long *)(this + 8) == 0x555555555555555) {
    detail::throwLengthError();
  }
  uVar10 = *(long *)(this + 8) + 1;
  uVar2 = *(ulong *)(this + 0x10);
  if (uVar10 < uVar2 * 2) {
    uVar10 = uVar2 * 2;
  }
  if (0x555555555555555 - uVar2 < uVar2) {
    uVar10 = 0x555555555555555;
  }
  lVar11 = (long)pos - *(long *)this;
  puVar8 = (unsigned_long *)operator_new(uVar10 * 0x18);
  *(ValueDriver **)((long)puVar8 + lVar11 + 0x10) = args->second;
  uVar4 = (args->first).second;
  *(unsigned_long *)((long)puVar8 + lVar11) = (args->first).first;
  ((unsigned_long *)((long)puVar8 + lVar11))[1] = uVar4;
  p = *(pointer *)this;
  lVar3 = *(long *)(this + 8);
  lVar9 = (long)p + (lVar3 * 0x18 - (long)pos);
  ppVar6 = p;
  puVar7 = puVar8;
  if (lVar9 == 0) {
    if (lVar3 != 0) {
      lVar9 = 0;
      do {
        *(undefined8 *)((long)puVar8 + lVar9 + 0x10) = *(undefined8 *)((long)&p->second + lVar9);
        puVar1 = (undefined8 *)((long)&(p->first).first + lVar9);
        uVar5 = puVar1[1];
        *(undefined8 *)((long)puVar8 + lVar9) = *puVar1;
        ((undefined8 *)((long)puVar8 + lVar9))[1] = uVar5;
        lVar9 = lVar9 + 0x18;
      } while (lVar3 * 0x18 != lVar9);
    }
  }
  else {
    for (; ppVar6 != pos; ppVar6 = ppVar6 + 1) {
      puVar7[2] = (unsigned_long)ppVar6->second;
      uVar4 = (ppVar6->first).second;
      *puVar7 = (ppVar6->first).first;
      puVar7[1] = uVar4;
      puVar7 = puVar7 + 3;
    }
    memcpy((void *)((long)puVar8 + lVar11 + 0x18),pos,((lVar9 - 0x18U) / 0x18) * 0x18 + 0x18);
  }
  if (p != (pointer)(this + 0x18)) {
    operator_delete(p);
  }
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(ulong *)(this + 0x10) = uVar10;
  *(unsigned_long **)this = puVar8;
  return (pointer)((long)puVar8 + lVar11);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}